

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Face.cpp
# Opt level: O0

void __thiscall Face::build_map(Face *this,Corner reference_corner,Eq_Pos_Table *eq_pos_table)

{
  ulong uVar1;
  size_type sVar2;
  reference __x;
  __enable_if_t<is_constructible<value_type,_pair<Position,_Color_*>_>::value,_pair<iterator,_bool>_>
  _Var3;
  Color *local_b8;
  pair<Position,_Color_*> local_b0;
  int local_94;
  _Rb_tree_iterator<std::pair<const_Position,_Color_*>_> _Stack_90;
  int i;
  undefined1 local_88;
  Color *local_70;
  pair<Position,_Color_*> local_68;
  undefined1 local_50 [8];
  vector<Position,_std::allocator<Position>_> eq_positions;
  int flat_entry;
  int entry;
  int layer;
  Position current_position;
  Eq_Pos_Table *eq_pos_table_local;
  Corner reference_corner_local;
  Face *this_local;
  
  entry = reference_corner;
  current_position._4_8_ = eq_pos_table;
  for (flat_entry = 0; flat_entry < 4; flat_entry = flat_entry + 1) {
    layer = flat_entry;
    for (eq_positions.super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._4_4_ = U;
        (int)eq_positions.super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_ < flat_entry * 2 + 1;
        eq_positions.super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ =
             eq_positions.super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_ + L) {
      current_position.reference_corner =
           eq_positions.super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_;
      eq_positions.super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ =
           flat_entry * flat_entry +
           eq_positions.super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_;
      Eq_Pos_Table::get_equivalent_positions
                ((vector<Position,_std::allocator<Position>_> *)local_50,
                 (Eq_Pos_Table *)current_position._4_8_,this->center_color,
                 (int)eq_positions.super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
      local_70 = this->color_data +
                 (int)eq_positions.super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage;
      std::pair<Position,_Color_*>::pair<Position_&,_Color_*,_true>
                (&local_68,(Position *)&entry,&local_70);
      _Var3 = std::
              map<Position,Color*,std::less<Position>,std::allocator<std::pair<Position_const,Color*>>>
              ::insert<std::pair<Position,Color*>>
                        ((map<Position,Color*,std::less<Position>,std::allocator<std::pair<Position_const,Color*>>>
                          *)&this->current_state,&local_68);
      _Stack_90 = _Var3.first._M_node;
      local_88 = _Var3.second;
      local_94 = 0;
      while( true ) {
        uVar1 = (ulong)local_94;
        sVar2 = std::vector<Position,_std::allocator<Position>_>::size
                          ((vector<Position,_std::allocator<Position>_> *)local_50);
        if (sVar2 <= uVar1) break;
        __x = std::vector<Position,_std::allocator<Position>_>::operator[]
                        ((vector<Position,_std::allocator<Position>_> *)local_50,(long)local_94);
        local_b8 = this->color_data +
                   (int)eq_positions.super__Vector_base<Position,_std::allocator<Position>_>._M_impl
                        .super__Vector_impl_data._M_end_of_storage;
        std::pair<Position,_Color_*>::pair<Position_&,_Color_*,_true>(&local_b0,__x,&local_b8);
        std::
        map<Position,Color*,std::less<Position>,std::allocator<std::pair<Position_const,Color*>>>::
        insert<std::pair<Position,Color*>>
                  ((map<Position,Color*,std::less<Position>,std::allocator<std::pair<Position_const,Color*>>>
                    *)&this->current_state,&local_b0);
        local_94 = local_94 + 1;
      }
      std::vector<Position,_std::allocator<Position>_>::~vector
                ((vector<Position,_std::allocator<Position>_> *)local_50);
    }
  }
  return;
}

Assistant:

void Face::build_map(Corner reference_corner, Eq_Pos_Table& eq_pos_table){
    Position current_position;
    current_position.reference_corner = reference_corner;
    for(int layer = 0; layer < 4; layer++){
        current_position.layer = layer;
        for(int entry = 0; entry < (2*layer + 1); entry++){
            current_position.entry = entry;
            int flat_entry = (layer*layer) + entry;
            std::vector<Position> eq_positions = eq_pos_table.get_equivalent_positions(center_color, flat_entry);
            current_state.insert(std::pair<Position, Color*>(current_position, &color_data[flat_entry]));
            for(int i = 0; i < eq_positions.size(); i++){
                current_state.insert(std::pair<Position, Color*>(eq_positions[i], &color_data[flat_entry]));
            }
        }
    }
}